

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall NetOptimize::eliminate_orphaned_memorydata(NetOptimize *this)

{
  int iVar1;
  bool bVar2;
  size_type sVar3;
  reference ppLVar4;
  reference pvVar5;
  size_type sVar6;
  undefined8 uVar7;
  long in_RDI;
  int k;
  bool orphaned;
  int j;
  int top_blob_index;
  int i;
  size_t layer_count;
  char *in_stack_ffffffffffffffb8;
  FILE *in_stack_ffffffffffffffc0;
  int local_24;
  int local_1c;
  int local_14;
  
  sVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_14 = 0;
  do {
    if (sVar3 <= (ulong)(long)local_14) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_14);
    bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    if (!bVar2) {
      ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_14);
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar4)->tops,0);
      iVar1 = *pvVar5;
      local_1c = local_14;
      do {
        do {
          local_1c = local_1c + 1;
          if (sVar3 <= (ulong)(long)local_1c) goto LAB_00120f6f;
          std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                     (long)local_1c);
          bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        } while (bVar2);
        bVar2 = true;
        local_24 = 0;
        while( true ) {
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_1c);
          sVar6 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar4)->bottoms);
          if (sVar6 <= (ulong)(long)local_24) break;
          ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_1c);
          pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&(*ppLVar4)->bottoms,(long)local_24);
          if (*pvVar5 == iVar1) {
            bVar2 = false;
            break;
          }
          local_24 = local_24 + 1;
        }
      } while (bVar2);
LAB_00120f6f:
      if (sVar3 <= (ulong)(long)local_1c) {
        in_stack_ffffffffffffffc0 = _stderr;
        std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                  ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                   (long)local_14);
        uVar7 = std::__cxx11::string::c_str();
        fprintf(in_stack_ffffffffffffffc0,"eliminate_orphaned_memorydata %s\n",uVar7);
        ppLVar4 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_14);
        std::__cxx11::string::operator=((string *)&(*ppLVar4)->type,"ncnnfused");
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int NetOptimize::eliminate_orphaned_memorydata()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "MemoryData")
            continue;

        // MemoryData - X
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type == "ncnnfused")
                continue;

            bool orphaned = true;
            for (int k=0; k<layers[j]->bottoms.size(); k++)
            {
                if (layers[j]->bottoms[k] == top_blob_index)
                {
                    orphaned = false;
                    break;
                }
            }

            if (!orphaned)
                break;
        }

        if (j < layer_count)
            continue;

        // assert orphaned == true
        fprintf(stderr, "eliminate_orphaned_memorydata %s\n", layers[i]->name.c_str());

        layers[i]->type = "ncnnfused";
    }

    return 0;
}